

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O2

int resampler_get_sample(void *_r)

{
  int iVar1;
  
  if ((0 < *(int *)((long)_r + 0xc)) ||
     ((iVar1 = 0, *(long *)((long)_r + 0x18) != 0 &&
      (resampler_fill_and_remove_delay((resampler *)_r), 0 < *(int *)((long)_r + 0xc))))) {
    if ((*(byte *)((long)_r + 0x30) | 2) == 3) {
      iVar1 = (int)((double)*(float *)((long)_r + (long)*(int *)((long)_r + 8) * 4 + 0x248) +
                   *(double *)((long)_r + 0x40));
    }
    else {
      iVar1 = (int)*(float *)((long)_r + (long)*(int *)((long)_r + 8) * 4 + 0x248);
    }
  }
  return iVar1;
}

Assistant:

int resampler_get_sample(void *_r)
{
    resampler * r = ( resampler * ) _r;
    if ( r->read_filled < 1 && r->phase_inc.quad)
        resampler_fill_and_remove_delay( r );
    if ( r->read_filled < 1 )
        return 0;
    if ( r->quality == RESAMPLER_QUALITY_BLEP || r->quality == RESAMPLER_QUALITY_BLAM )
        return (int)(r->buffer_out[ r->read_pos ] + r->accumulator);
    else
        return (int)r->buffer_out[ r->read_pos ];
}